

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_man.cpp
# Opt level: O2

bool __thiscall CmdMan::Execute(CmdMan *this)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  bool bVar3;
  string s;
  string path;
  ifstream fin;
  byte abStack_208 [488];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"man: invalid option");
    std::endl<char,std::char_traits<char>>(poVar1);
    return false;
  }
  std::__cxx11::string::string((string *)&path,"manual/",(allocator *)&fin);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType>_>_>
           ::operator[](&commandMap_abi_cxx11_,
                        (key_type *)
                        ((this->super_Command).parameter.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next + 1));
  switch(*pmVar2) {
  case CMD_INVA:
    poVar1 = std::operator<<((ostream *)&std::cout,"No manual entry for ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((this->super_Command).parameter.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
    bVar3 = false;
    goto LAB_0010bd59;
  case CMD_CP:
    break;
  case CMD_CMP:
    break;
  case CMD_WC:
    break;
  case CMD_CAT:
    break;
  case CMD_MAN:
    break;
  case CMD_SH:
    break;
  default:
    goto switchD_0010bc6e_default;
  }
  std::__cxx11::string::append((char *)&path);
switchD_0010bc6e_default:
  std::ifstream::ifstream(&fin,(string *)&path,_S_in);
  while ((abStack_208[*(long *)(_fin + -0x18)] & 2) == 0) {
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fin,(string *)&s);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&s);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&s);
  }
  std::ifstream::~ifstream(&fin);
  bVar3 = true;
LAB_0010bd59:
  std::__cxx11::string::~string((string *)&path);
  return bVar3;
}

Assistant:

bool CmdMan::Execute(){
	if(option.size() != 0){
		cout << "man: invalid option" << endl;
		return false;
	}
	string path("manual/");
	switch(commandMap[parameter.front()]){
	case CMD_INVA:
		cout << "No manual entry for " << parameter.front() << endl;
		return false;
	case CMD_CP:
		path += "cp";
		break;
	case CMD_CMP:
		path += "cmp";
		break;
	case CMD_WC:
		path += "wc";
		break;
	case CMD_CAT:
		path += "cat";
		break;
	case CMD_MAN:
		path += "man";
		break;
	case CMD_SH:
		path += "sh";
		break;
	}
	ifstream fin(path);
	while(!fin.eof()){
		string s;
		getline(fin, s);
		cout << s << endl;
	}

	return true;
}